

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O1

Counts * __thiscall
wasm::InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts>::
operator[](InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts>
           *this,Function **k)

{
  InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts> *pIVar1;
  Function *pFVar2;
  _List_node_base *p_Var3;
  long *plVar4;
  undefined8 *puVar5;
  long lVar6;
  _Hash_node_base *p_Var7;
  __node_ptr p_Var8;
  __node_ptr p_Var9;
  InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts> *__s;
  InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts> *pIVar10;
  _List_node_base *p_Var11;
  ulong uVar12;
  size_type __n;
  long *plVar13;
  __node_ptr p_Var14;
  ulong uVar15;
  pointer __ptr_1;
  __node_ptr p_Var16;
  undefined1 auVar17 [16];
  pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts> kv;
  __buckets_alloc_type __alloc;
  __node_base_ptr local_68;
  _List_node_base _Stack_60;
  undefined8 uStack_50;
  InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts> *local_48;
  __node_ptr local_40;
  undefined8 local_38;
  
  kv.second.super_InsertOrderedMap<wasm::HeapType,_unsigned_long>.List.
  super__List_base<std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
  ._M_impl._M_node._M_size = (size_t)&local_68;
  local_68 = (__node_base_ptr)0x0;
  uStack_50 = 0;
  pFVar2 = *k;
  _Stack_60._M_next = &_Stack_60;
  _Stack_60._M_prev = &_Stack_60;
  InsertOrderedMap<wasm::HeapType,_unsigned_long>::InsertOrderedMap
            ((InsertOrderedMap<wasm::HeapType,_unsigned_long> *)&kv,
             (InsertOrderedMap<wasm::HeapType,_unsigned_long> *)
             ((long)&kv.second.super_InsertOrderedMap<wasm::HeapType,_unsigned_long>.List.
                     super__List_base<std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
                     ._M_impl._M_node + 0x10));
  p_Var11 = _Stack_60._M_next;
  while (p_Var11 != &_Stack_60) {
    p_Var3 = p_Var11->_M_next;
    operator_delete(p_Var11,0x20);
    p_Var11 = p_Var3;
  }
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)((long)&kv.second.super_InsertOrderedMap<wasm::HeapType,_unsigned_long>.List.
                           super__List_base<std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
                           ._M_impl._M_node + 0x10));
  p_Var8 = (__node_ptr)operator_new(0x18);
  local_48 = this + 0x38;
  (p_Var8->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  *(Function **)
   &(p_Var8->
    super__Hash_node_value<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>,_false>
    ).
    super__Hash_node_value_base<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>_>
    ._M_storage._M_storage = pFVar2;
  *(InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts> **)
   ((long)&(p_Var8->
           super__Hash_node_value<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>,_false>
           ).
           super__Hash_node_value_base<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>_>
           ._M_storage._M_storage + 8) = local_48;
  uVar15 = *(ulong *)(this + 8);
  uVar12 = (ulong)pFVar2 % uVar15;
  p_Var9 = std::
           _Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>,_std::allocator<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_node((_Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>,_std::allocator<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)this,uVar12,
                          (key_type *)
                          &p_Var8->
                           super__Hash_node_value<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>,_false>
                          ,(__hash_code)
                           &p_Var8->
                            super__Hash_node_value<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>,_false>
                         );
  p_Var14 = p_Var8;
  p_Var16 = p_Var9;
  if (p_Var9 == (__node_ptr)0x0) {
    local_38 = *(undefined8 *)(this + 0x28);
    local_40 = p_Var9;
    auVar17 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)(this + 0x20),uVar15,*(ulong *)(this + 0x18));
    __n = auVar17._8_8_;
    if ((auVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      if (__n == 1) {
        __s = this + 0x30;
        *(undefined8 *)(this + 0x30) = 0;
      }
      else {
        __s = (InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts>
               *)__gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                           ((new_allocator<std::__detail::_Hash_node_base_*> *)
                            ((long)&kv.second.super_InsertOrderedMap<wasm::HeapType,_unsigned_long>.
                                    List.
                                    super__List_base<std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
                                    ._M_impl._M_node + 0x10),__n,(void *)0x0);
        memset(__s,0,__n * 8);
      }
      plVar13 = *(long **)(this + 0x10);
      *(undefined8 *)(this + 0x10) = 0;
      if (plVar13 != (long *)0x0) {
        pIVar1 = this + 0x10;
        uVar15 = 0;
        do {
          plVar4 = (long *)*plVar13;
          uVar12 = (ulong)plVar13[1] % __n;
          if (*(long **)(__s + uVar12 * 8) == (long *)0x0) {
            *plVar13 = *(long *)pIVar1;
            *(long **)pIVar1 = plVar13;
            *(InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts>
              **)(__s + uVar12 * 8) = pIVar1;
            if (*plVar13 != 0) {
              pIVar10 = __s + uVar15 * 8;
              goto LAB_00a84bdc;
            }
          }
          else {
            *plVar13 = **(long **)(__s + uVar12 * 8);
            pIVar10 = *(InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts>
                        **)(__s + uVar12 * 8);
            uVar12 = uVar15;
LAB_00a84bdc:
            *(long **)pIVar10 = plVar13;
          }
          plVar13 = plVar4;
          uVar15 = uVar12;
        } while (plVar4 != (long *)0x0);
      }
      if (this + 0x30 !=
          *(InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts> **)
           this) {
        operator_delete(*(InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts>
                          **)this,*(long *)(this + 8) << 3);
      }
      *(size_type *)(this + 8) = __n;
      *(InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts> **)this
           = __s;
      uVar12 = (ulong)pFVar2 % __n;
    }
    lVar6 = *(long *)this;
    puVar5 = *(undefined8 **)(lVar6 + uVar12 * 8);
    if (puVar5 == (undefined8 *)0x0) {
      p_Var7 = *(_Hash_node_base **)(this + 0x10);
      (p_Var8->super__Hash_node_base)._M_nxt = p_Var7;
      *(__node_ptr *)(this + 0x10) = p_Var8;
      if (p_Var7 != (_Hash_node_base *)0x0) {
        *(__node_ptr *)(lVar6 + ((ulong)p_Var7[1]._M_nxt % *(ulong *)(this + 8)) * 8) = p_Var8;
      }
      *(InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts> **)
       (*(long *)this + uVar12 * 8) = this + 0x10;
    }
    else {
      (p_Var8->super__Hash_node_base)._M_nxt = (_Hash_node_base *)*puVar5;
      **(undefined8 **)(lVar6 + uVar12 * 8) = p_Var8;
    }
    *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
    p_Var9 = local_40;
    p_Var14 = (__node_ptr)0x0;
    p_Var16 = p_Var8;
  }
  if (p_Var14 != (__node_ptr)0x0) {
    operator_delete(p_Var14,0x18);
  }
  if (p_Var9 == (__node_ptr)0x0) {
    p_Var11 = (_List_node_base *)operator_new(0x68);
    p_Var11[1]._M_next = (_List_node_base *)pFVar2;
    InsertOrderedMap<wasm::HeapType,_unsigned_long>::InsertOrderedMap
              ((InsertOrderedMap<wasm::HeapType,_unsigned_long> *)&p_Var11[1]._M_prev,
               (InsertOrderedMap<wasm::HeapType,_unsigned_long> *)&kv);
    std::__detail::_List_node_base::_M_hook(p_Var11);
    *(long *)(this + 0x48) = *(long *)(this + 0x48) + 1;
    *(undefined8 *)
     ((long)&(p_Var16->
             super__Hash_node_value<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>,_false>
             ).
             super__Hash_node_value_base<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>_>
             ._M_storage._M_storage + 8) = *(undefined8 *)(this + 0x40);
  }
  lVar6 = *(long *)((long)&(p_Var16->
                           super__Hash_node_value<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>,_false>
                           ).
                           super__Hash_node_value_base<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>_>
                           ._M_storage._M_storage + 8);
  while (kv.second.super_InsertOrderedMap<wasm::HeapType,_unsigned_long>.Map._M_h._M_single_bucket
         != (__node_base_ptr)
            &kv.second.super_InsertOrderedMap<wasm::HeapType,_unsigned_long>.Map._M_h.
             _M_single_bucket) {
    p_Var7 = (kv.second.super_InsertOrderedMap<wasm::HeapType,_unsigned_long>.Map._M_h.
             _M_single_bucket)->_M_nxt;
    operator_delete(kv.second.super_InsertOrderedMap<wasm::HeapType,_unsigned_long>.Map._M_h.
                    _M_single_bucket,0x20);
    kv.second.super_InsertOrderedMap<wasm::HeapType,_unsigned_long>.Map._M_h._M_single_bucket =
         p_Var7;
  }
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&kv);
  return (Counts *)(lVar6 + 0x18);
}

Assistant:

T& operator[](const Key& k) {
    std::pair<const Key, T> kv = {k, {}};
    return insert(kv).first->second;
  }